

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool google::protobuf::compiler::anon_unknown_0::IsUpperCamelCase(string *name)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  string *__range3;
  string *name_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name);
    bVar1 = IsUppercase(*pcVar3);
    if (bVar1) {
      __end3._M_current = (char *)std::__cxx11::string::begin();
      _Stack_30._M_current = (char *)std::__cxx11::string::end();
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffd0), bVar1) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3);
        if (*pcVar4 == '_') {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
      name_local._7_1_ = true;
    }
    else {
      name_local._7_1_ = false;
    }
  }
  else {
    name_local._7_1_ = true;
  }
  return name_local._7_1_;
}

Assistant:

bool IsUpperCamelCase(const std::string& name) {
  if (name.empty()) {
    return true;
  }
  // Name must start with an upper case character.
  if (!IsUppercase(name[0])) {
    return false;
  }
  // Must not contains underscore.
  for (const char c : name) {
    if (c == '_') {
      return false;
    }
  }
  return true;
}